

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintStatement.h
# Opt level: O1

void __thiscall PrintStatement::execute(PrintStatement *this,Environment *env)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 *puVar6;
  ptr<Value> value;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10,0,env);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Value is null","");
    ExceptionObjects::null_value((ExceptionObjects *)&local_48,&local_78);
    uVar2 = (undefined4)local_48;
    uVar3 = local_48._4_4_;
    uVar4 = (undefined4)uStack_40;
    uVar5 = uStack_40._4_4_;
    local_48 = 0;
    uStack_40 = 0;
    *puVar6 = uVar2;
    puVar6[1] = uVar3;
    puVar6[2] = uVar4;
    puVar6[3] = uVar5;
    __cxa_throw(puVar6,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  (**peVar1->_vptr_Expression)(&local_30);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x10))(&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_78._M_dataplus._M_p,local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    return;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Value is null","");
  ExceptionObjects::null_value((ExceptionObjects *)&local_58,&local_78);
  uVar2 = (undefined4)local_58;
  uVar3 = local_58._4_4_;
  uVar4 = (undefined4)uStack_50;
  uVar5 = uStack_50._4_4_;
  local_58 = 0;
  uStack_50 = 0;
  *puVar6 = uVar2;
  puVar6[1] = uVar3;
  puVar6[2] = uVar4;
  puVar6[3] = uVar5;
  __cxa_throw(puVar6,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void execute(Environment *env) override {
        if(!expression)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));
        ptr<Value> value = expression -> evaluate(env);
        if(!value)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));

        std::cout << value -> asString();
    }